

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

Bucket * __thiscall rengine::Signal<>::findBucket(Signal<> *this,SignalEmitter *emitter)

{
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *this_00;
  bool bVar1;
  reference ppBVar2;
  BucketBase *bucket;
  iterator __end2;
  iterator __begin2;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *__range2;
  SignalEmitter *emitter_local;
  Signal<> *this_local;
  
  if (emitter->m_buckets !=
      (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
       *)0x0) {
    this_00 = emitter->m_buckets;
    __end2 = std::
             vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
             ::begin(this_00);
    bucket = (BucketBase *)
             std::
             vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
             ::end(this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<rengine::SignalEmitter::BucketBase_**,_std::vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>_>
                                       *)&bucket), bVar1) {
      ppBVar2 = __gnu_cxx::
                __normal_iterator<rengine::SignalEmitter::BucketBase_**,_std::vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>_>
                ::operator*(&__end2);
      if ((((Bucket *)*ppBVar2)->super_BucketBase).signal == &this->super_SignalBase) {
        return (Bucket *)*ppBVar2;
      }
      __gnu_cxx::
      __normal_iterator<rengine::SignalEmitter::BucketBase_**,_std::vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>_>
      ::operator++(&__end2);
    }
  }
  return (Bucket *)0x0;
}

Assistant:

Bucket *findBucket(SignalEmitter *emitter) const
    {
        if (!emitter->m_buckets)
            return 0;
        for (SignalEmitter::BucketBase *bucket : *emitter->m_buckets) {
            if (bucket->signal == this)
                return static_cast<Bucket *>(bucket);
        }
        return 0;
    }